

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.hpp
# Opt level: O3

void __thiscall
diy::Master::IExchangeInfo::IExchangeInfo(IExchangeInfo *this,communicator *c,Profiler *p)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->_vptr_IExchangeInfo = (_func_int **)&PTR__IExchangeInfo_0013cc38;
  (this->comm).comm_.data = (c->comm_).data;
  iVar1 = c->size_;
  (this->comm).rank_ = c->rank_;
  (this->comm).size_ = iVar1;
  (this->comm).owner_ = false;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013c6e8;
  (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  this->prof = p;
  return;
}

Assistant:

IExchangeInfo(mpi::communicator c, stats::Profiler& p):
                            comm(c),
                            prof(p)                             {}